

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void read_simpletiled_instance(xml_node<char> *node,string *current_dir)

{
  bool bVar1;
  undefined4 uVar2;
  bool bVar3;
  uint width;
  uint height;
  uint uVar4;
  int seed;
  ostream *poVar5;
  xml_node<char> *node_00;
  iterator iVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  __node_base _Var10;
  int iVar11;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *p_Var12;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  optional<Array2D<Color>_> success;
  string name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  tiles_id;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
  tiles_map;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  neighbors_ids;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  neighbors;
  vector<char,_std::allocator<char>_> buffer;
  string subset;
  vector<Tile<Color>,_std::allocator<Tile<Color>_>_> tiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10540;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
  tile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10330;
  ifstream config_file;
  undefined8 auStack_10228 [36];
  xml_document<char> data_document;
  
  std::__cxx11::string::string((string *)&data_document,"name",(allocator *)&config_file);
  rapidxml::get_attribute(&name,node,(string *)&data_document);
  std::__cxx11::string::~string((string *)&data_document);
  std::__cxx11::string::string((string *)&data_document,"subset",(allocator *)&tile);
  std::__cxx11::string::string((string *)&config_file,"tiles",(allocator *)&tiles_map);
  rapidxml::get_attribute(&subset,node,(string *)&data_document,(string *)&config_file);
  std::__cxx11::string::~string((string *)&config_file);
  std::__cxx11::string::~string((string *)&data_document);
  std::__cxx11::string::string((string *)&config_file,"periodic",(allocator *)&tiles_map);
  std::__cxx11::string::string((string *)&tile,"False",(allocator *)&tiles_id);
  rapidxml::get_attribute((string *)&data_document,node,(string *)&config_file,&tile.first);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &data_document,"True");
  std::__cxx11::string::~string((string *)&data_document);
  std::__cxx11::string::~string((string *)&tile);
  std::__cxx11::string::~string((string *)&config_file);
  std::__cxx11::string::string((string *)&config_file,"width",(allocator *)&tiles_map);
  std::__cxx11::string::string((string *)&tile,"48",(allocator *)&tiles_id);
  rapidxml::get_attribute((string *)&data_document,node,(string *)&config_file,&tile.first);
  width = std::__cxx11::stoi((string *)&data_document,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&data_document);
  std::__cxx11::string::~string((string *)&tile);
  std::__cxx11::string::~string((string *)&config_file);
  std::__cxx11::string::string((string *)&config_file,"height",(allocator *)&tiles_map);
  std::__cxx11::string::string((string *)&tile,"48",(allocator *)&tiles_id);
  rapidxml::get_attribute((string *)&data_document,node,(string *)&config_file,&tile.first);
  height = std::__cxx11::stoi((string *)&data_document,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&data_document);
  std::__cxx11::string::~string((string *)&tile);
  std::__cxx11::string::~string((string *)&config_file);
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)&name);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,(string *)&subset);
  poVar5 = std::operator<<(poVar5," started!");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator+(&tile.first,"samples/",&name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data_document
                 ,&tile.first,"/data.xml");
  std::ifstream::ifstream(&config_file,(string *)&data_document,_S_in);
  std::__cxx11::string::~string((string *)&data_document);
  std::__cxx11::string::~string((string *)&tile);
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_10228 + *(long *)(_config_file + -0x18));
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,std::allocator<char>> *)&buffer,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&data_document);
  data_document.super_xml_node<char>.super_xml_base<char>.m_name =
       (char *)((ulong)data_document.super_xml_node<char>.super_xml_base<char>.m_name &
               0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&buffer,(char *)&data_document);
  data_document.super_memory_pool<char>.m_end =
       (char *)&data_document.super_memory_pool<char>.m_alloc_func;
  data_document.super_xml_node<char>.m_contents = (char *)0x0;
  data_document.super_xml_node<char>.m_contents_size = 0;
  data_document.super_xml_node<char>.m_prev_sibling = (xml_node<char> *)0x0;
  data_document.super_xml_node<char>.m_next_sibling = (xml_node<char> *)0x0;
  data_document.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  data_document.super_xml_node<char>.m_last_attribute = (xml_attribute<char> *)0x0;
  data_document.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  data_document.super_xml_node<char>.m_last_node = (xml_node<char> *)0x0;
  data_document.super_memory_pool<char>.m_begin =
       data_document.super_memory_pool<char>.m_static_memory;
  data_document.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  data_document.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  data_document.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  data_document.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  data_document.super_xml_node<char>.super_xml_base<char>.m_name_size = 0;
  data_document.super_xml_node<char>.super_xml_base<char>.m_value_size = 0;
  data_document.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  data_document.super_xml_node<char>.m_prefix = (char *)0x0;
  data_document.super_xml_node<char>.m_xmlns = (char *)0x0;
  data_document.super_xml_node<char>.m_prefix_size._0_4_ = 0;
  data_document.super_xml_node<char>.m_prefix_size._4_4_ = 0;
  data_document.super_xml_node<char>.m_xmlns_size._0_4_ = 0;
  data_document.super_xml_node<char>._68_8_ = 0;
  data_document.super_memory_pool<char>.m_nullstr = (char *)0x0;
  data_document.super_memory_pool<char>.m_xmlns_xml = (char *)0x0;
  data_document.super_memory_pool<char>.m_xmlns_xmlns = (char *)0x0;
  data_document.super_memory_pool<char>.m_ptr = data_document.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>
            (&data_document,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(xml_document<char> *)0x0);
  node_00 = rapidxml::xml_node<char>::first_node
                      (&data_document.super_xml_node<char>,"set",(char *)0x0,0,0,true);
  std::__cxx11::string::string((string *)&tiles_map,"size",(allocator *)&tiles_id);
  rapidxml::get_attribute(&tile.first,node_00,(string *)&tiles_map);
  uVar4 = std::__cxx11::stoi(&tile.first,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tile);
  std::__cxx11::string::~string((string *)&tiles_map);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tiles_id,
                 current_dir,"/");
  std::operator+(&tile.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tiles_id,
                 &name);
  read_tiles(&tiles_map,node_00,&tile.first,&subset,uVar4);
  std::__cxx11::string::~string((string *)&tile);
  std::__cxx11::string::~string((string *)&tiles_id);
  tiles_id._M_h._M_buckets = &tiles_id._M_h._M_single_bucket;
  tiles_id._M_h._M_bucket_count = 1;
  tiles_id._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tiles_id._M_h._M_element_count = 0;
  tiles_id._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tiles_id._M_h._M_rehash_policy._M_next_resize = 0;
  tiles_id._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tiles.super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tiles.super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tiles.super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar11 = 0;
  for (_Var10 = tiles_map._M_h._M_before_begin; _Var10._M_nxt != (_Hash_node_base *)0x0;
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_true>
              (&tile,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
                      *)(_Var10._M_nxt + 1));
    std::__cxx11::string::string((string *)&success,(string *)&tile);
    success.super_optional_move_assign_base<Array2D<Color>,_false>.
    super_optional_copy_assign_base<Array2D<Color>,_false>.
    super_optional_move_base<Array2D<Color>,_false>.super_optional_copy_base<Array2D<Color>,_false>.
    super_optional_operations_base<Array2D<Color>_>.
    super_optional_storage_base<Array2D<Color>,_false>._32_4_ = iVar11;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&tiles_id,(string *)&success);
    std::__cxx11::string::~string((string *)&success);
    std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::push_back(&tiles,&tile.second);
    iVar11 = iVar11 + 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
    ::~pair(&tile);
  }
  read_neighbors_abi_cxx11_(&neighbors,node_00);
  neighbors_ids.
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  neighbors_ids.
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  neighbors_ids.
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var12 = &(neighbors.
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ; p_Var12 !=
        &(neighbors.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ; p_Var12 = p_Var12 + 1) {
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                   *)&tile,p_Var12);
    uVar2 = tile.second.data.super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>.
            _M_impl.super__Vector_impl_data._M_finish._0_4_;
    uVar4 = (uint)tile.first._M_dataplus._M_p;
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&tiles_id._M_h,
                   (key_type *)
                   &tile.second.data.
                    super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&tiles_id._M_h,(key_type *)&tile.first._M_string_length);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
          ._M_cur != (__node_type *)0x0) {
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&tiles_id._M_h,
                              (key_type *)
                              &tile.second.data.
                               super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&tiles_id._M_h,(key_type *)&tile.first._M_string_length);
        success.super_optional_move_assign_base<Array2D<Color>,_false>.
        super_optional_copy_assign_base<Array2D<Color>,_false>.
        super_optional_move_base<Array2D<Color>,_false>.
        super_optional_copy_base<Array2D<Color>,_false>.
        super_optional_operations_base<Array2D<Color>_>.
        super_optional_storage_base<Array2D<Color>,_false>.field_0.m_value.width = *pmVar8;
        success.super_optional_move_assign_base<Array2D<Color>,_false>.
        super_optional_copy_assign_base<Array2D<Color>,_false>.
        super_optional_move_base<Array2D<Color>,_false>.
        super_optional_copy_base<Array2D<Color>,_false>.
        super_optional_operations_base<Array2D<Color>_>.
        super_optional_storage_base<Array2D<Color>,_false>.field_0._12_4_ = *pmVar7;
        success.super_optional_move_assign_base<Array2D<Color>,_false>.
        super_optional_copy_assign_base<Array2D<Color>,_false>.
        super_optional_move_base<Array2D<Color>,_false>.
        super_optional_copy_base<Array2D<Color>,_false>.
        super_optional_operations_base<Array2D<Color>_>.
        super_optional_storage_base<Array2D<Color>,_false>.field_0.m_value.height = uVar4;
        success.super_optional_move_assign_base<Array2D<Color>,_false>.
        super_optional_copy_assign_base<Array2D<Color>,_false>.
        super_optional_move_base<Array2D<Color>,_false>.
        super_optional_copy_base<Array2D<Color>,_false>.
        super_optional_operations_base<Array2D<Color>_>.
        super_optional_storage_base<Array2D<Color>,_false>.field_0._8_4_ = uVar2;
        std::
        vector<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>>>
        ::emplace_back<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>>
                  ((vector<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>>>
                    *)&neighbors_ids,
                   (tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int> *)&success);
      }
    }
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)&tile);
  }
  iVar11 = 0xb;
  do {
    iVar11 = iVar11 + -1;
    if (iVar11 == 0) break;
    seed = get_random_seed();
    success.super_optional_move_assign_base<Array2D<Color>,_false>.
    super_optional_copy_assign_base<Array2D<Color>,_false>.
    super_optional_move_base<Array2D<Color>,_false>.super_optional_copy_base<Array2D<Color>,_false>.
    super_optional_operations_base<Array2D<Color>_>.
    super_optional_storage_base<Array2D<Color>,_false>.field_0.m_value.height._0_1_ = bVar3;
    TilingWFC<Color>::TilingWFC
              ((TilingWFC<Color> *)&tile,&tiles,&neighbors_ids,height,width,
               (TilingWFCOptions *)&success,seed);
    TilingWFC<Color>::run(&success,(TilingWFC<Color> *)&tile);
    bVar1 = success.super_optional_move_assign_base<Array2D<Color>,_false>.
            super_optional_copy_assign_base<Array2D<Color>,_false>.
            super_optional_move_base<Array2D<Color>,_false>.
            super_optional_copy_base<Array2D<Color>,_false>.
            super_optional_operations_base<Array2D<Color>_>.
            super_optional_storage_base<Array2D<Color>,_false>.m_has_value;
    poVar5 = (ostream *)&std::cout;
    pcVar9 = "failed!";
    if (success.super_optional_move_assign_base<Array2D<Color>,_false>.
        super_optional_copy_assign_base<Array2D<Color>,_false>.
        super_optional_move_base<Array2D<Color>,_false>.
        super_optional_copy_base<Array2D<Color>,_false>.
        super_optional_operations_base<Array2D<Color>_>.
        super_optional_storage_base<Array2D<Color>,_false>.m_has_value == true) {
      std::operator+(&bStack_10560,"results/",&name);
      std::operator+(&bStack_10540,&bStack_10560,"_");
      std::operator+(&bStack_10350,&bStack_10540,&subset);
      std::operator+(&bStack_10330,&bStack_10350,".png");
      write_image_png(&bStack_10330,(Array2D<Color> *)&success);
      std::__cxx11::string::~string((string *)&bStack_10330);
      std::__cxx11::string::~string((string *)&bStack_10350);
      std::__cxx11::string::~string((string *)&bStack_10540);
      std::__cxx11::string::~string((string *)&bStack_10560);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&name);
      pcVar9 = " finished!";
    }
    poVar5 = std::operator<<(poVar5,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    tl::detail::optional_storage_base<Array2D<Color>,_false>::~optional_storage_base
              ((optional_storage_base<Array2D<Color>,_false> *)&success);
    TilingWFC<Color>::~TilingWFC((TilingWFC<Color> *)&tile);
  } while (bVar1 == false);
  std::
  _Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&neighbors_ids.
                   super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&neighbors);
  std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::~vector(&tiles);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&tiles_id._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&tiles_map._M_h);
  rapidxml::memory_pool<char>::~memory_pool(&data_document.super_memory_pool<char>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::ifstream::~ifstream(&config_file);
  std::__cxx11::string::~string((string *)&subset);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void read_simpletiled_instance(xml_node<> *node,
                               const string &current_dir) noexcept {
  string name = rapidxml::get_attribute(node, "name");
  string subset = rapidxml::get_attribute(node, "subset", "tiles");
  bool periodic_output =
      (rapidxml::get_attribute(node, "periodic", "False") == "True");
  unsigned width = stoi(rapidxml::get_attribute(node, "width", "48"));
  unsigned height = stoi(rapidxml::get_attribute(node, "height", "48"));

  cout << name << " " << subset << " started!" << endl;

  ifstream config_file("samples/" + name + "/data.xml");
  vector<char> buffer((istreambuf_iterator<char>(config_file)),
                      istreambuf_iterator<char>());
  buffer.push_back('\0');
  xml_document<> data_document;
  data_document.parse<0>(&buffer[0]);
  xml_node<> *data_root_node = data_document.first_node("set");
  unsigned size = stoi(rapidxml::get_attribute(data_root_node, "size"));

  unordered_map<string, Tile<Color>> tiles_map =
      read_tiles(data_root_node, current_dir + "/" + name, subset, size);
  unordered_map<string, unsigned> tiles_id;
  vector<Tile<Color>> tiles;
  unsigned id = 0;
  for (pair<string, Tile<Color>> tile : tiles_map) {
    tiles_id.insert({tile.first, id});
    tiles.push_back(tile.second);
    id++;
  }

  vector<tuple<string, unsigned, string, unsigned>> neighbors =
      read_neighbors(data_root_node);
  vector<tuple<unsigned, unsigned, unsigned, unsigned>> neighbors_ids;
  for (auto neighbor : neighbors) {
    const string &neighbor1 = get<0>(neighbor);
    const int &orientation1 = get<1>(neighbor);
    const string &neighbor2 = get<2>(neighbor);
    const int &orientation2 = get<3>(neighbor);
    if (tiles_id.find(neighbor1) == tiles_id.end()) {
      continue;
    }
    if (tiles_id.find(neighbor2) == tiles_id.end()) {
      continue;
    }
    neighbors_ids.push_back(make_tuple(tiles_id[neighbor1], orientation1,
                                       tiles_id[neighbor2], orientation2));
  }

  for (unsigned test = 0; test < 10; test++) {
    int seed = get_random_seed();
    TilingWFC<Color> wfc(tiles, neighbors_ids, height, width, {periodic_output},
                         seed);
    tl::optional<Array2D<Color>> success = wfc.run();
    if (success.has_value()) {
      write_image_png("results/" + name + "_" + subset + ".png", *success);
      cout << name << " finished!" << endl;
      break;
    } else {
      cout << "failed!" << endl;
    }
  }
}